

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QFileDialogPrivate * __thiscall QFileDialog::directory(QFileDialog *this)

{
  bool bVar1;
  QFileDialogPrivate *pQVar2;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileDialogPrivate *d;
  QString dir;
  QString *in_stack_ffffffffffffff68;
  QFileDialogPrivate *this_00;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  byte bVar3;
  undefined1 local_60 [24];
  QUrl local_48;
  undefined1 local_40 [24];
  QUrl local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = d_func((QFileDialog *)0x75507d);
  if (((pQVar2->super_QDialogPrivate).nativeDialogInUse & 1U) == 0) {
    QFileDialogPrivate::rootPath
              ((QFileDialogPrivate *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    QDir::QDir((QDir *)in_RDI,(QString *)local_60);
    QString::~QString((QString *)0x75519e);
  }
  else {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QFileDialogPrivate::directory_sys(this_00);
    QUrl::toLocalFile();
    QUrl::~QUrl(&local_28);
    bVar1 = QString::isEmpty((QString *)0x7550f0);
    bVar3 = 0;
    if (bVar1) {
      QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x75510c)
      ;
      QFileDialogOptions::initialDirectory();
      bVar3 = 1;
      QUrl::toLocalFile();
    }
    else {
      QString::QString((QString *)in_RDI,in_stack_ffffffffffffff68);
    }
    QDir::QDir((QDir *)in_RDI,(QString *)local_40);
    QString::~QString((QString *)0x755157);
    if ((bVar3 & 1) != 0) {
      QUrl::~QUrl(&local_48);
    }
    QString::~QString((QString *)0x755174);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QDir QFileDialog::directory() const
{
    Q_D(const QFileDialog);
    if (d->nativeDialogInUse) {
        QString dir = d->directory_sys().toLocalFile();
        return QDir(dir.isEmpty() ? d->options->initialDirectory().toLocalFile() : dir);
    }
    return d->rootPath();
}